

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EulerAngles.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::EulerAngles::Decode(EulerAngles *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  EulerAngles *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0xc) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar2 = KDataStream::operator>>(local_18,(float *)&this->m_f32Psi);
  pKVar2 = KDataStream::operator>>(pKVar2,(float *)&this->m_f32Theta);
  KDataStream::operator>>(pKVar2,(float *)&this->m_f32Phi);
  return;
}

Assistant:

void EulerAngles::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < EULER_ANGLES_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_f32Psi
           >> m_f32Theta
           >> m_f32Phi;
}